

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.h
# Opt level: O0

bool google::protobuf::internal::WireFormatLite::ReadGroup<google::protobuf::Message>
               (int field_number,CodedInputStream *input,Message *value)

{
  bool bVar1;
  uint32_t expected;
  Message *value_local;
  CodedInputStream *input_local;
  int field_number_local;
  
  bVar1 = io::CodedInputStream::IncrementRecursionDepth(input);
  if (bVar1) {
    bVar1 = MessageLite::MergePartialFromCodedStream(&value->super_MessageLite,input);
    if (bVar1) {
      io::CodedInputStream::UnsafeDecrementRecursionDepth(input);
      expected = MakeTag(field_number,WIRETYPE_END_GROUP);
      bVar1 = io::CodedInputStream::LastTagWas(input,expected);
      if (bVar1) {
        input_local._7_1_ = true;
      }
      else {
        input_local._7_1_ = false;
      }
    }
    else {
      input_local._7_1_ = false;
    }
  }
  else {
    input_local._7_1_ = false;
  }
  return input_local._7_1_;
}

Assistant:

inline bool WireFormatLite::ReadGroup(int field_number,
                                      io::CodedInputStream* input,
                                      MessageType* value) {
  if (!input->IncrementRecursionDepth()) return false;
  if (!value->MergePartialFromCodedStream(input)) return false;
  input->UnsafeDecrementRecursionDepth();
  // Make sure the last thing read was an end tag for this group.
  if (!input->LastTagWas(MakeTag(field_number, WIRETYPE_END_GROUP))) {
    return false;
  }
  return true;
}